

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool Js::JavascriptRegExp::HasOriginalRegExType(RecyclableObject *instance)

{
  JavascriptLibrary *this;
  DynamicType *pDVar1;
  DynamicType *pDVar2;
  DynamicObject *this_00;
  DynamicObject *pDVar3;
  undefined1 local_31;
  DynamicObject *regexPrototype;
  JavascriptLibrary *library;
  RecyclableObject *instance_local;
  
  this = RecyclableObject::GetLibrary(instance);
  pDVar1 = (DynamicType *)RecyclableObject::GetType(instance);
  pDVar2 = JavascriptLibrary::GetRegexType(this);
  if (pDVar1 == pDVar2) {
    this_00 = JavascriptLibraryBase::GetRegExpPrototype(&this->super_JavascriptLibraryBase);
    pDVar3 = (DynamicObject *)Js::JavascriptOperators::GetPrototype(instance);
    local_31 = false;
    if (pDVar3 == this_00) {
      pDVar1 = (DynamicType *)RecyclableObject::GetType(&this_00->super_RecyclableObject);
      pDVar2 = JavascriptLibrary::GetRegexPrototypeType(this);
      local_31 = pDVar1 == pDVar2;
    }
    instance_local._7_1_ = local_31;
  }
  else {
    instance_local._7_1_ = false;
  }
  return instance_local._7_1_;
}

Assistant:

bool JavascriptRegExp::HasOriginalRegExType(RecyclableObject* instance)
    {
        JavascriptLibrary* library = instance->GetLibrary();

        if (instance->GetType() != library->GetRegexType())
        {
            return false;
        }

        DynamicObject* regexPrototype = library->GetRegExpPrototype();
        return JavascriptOperators::GetPrototype(instance) == regexPrototype
            && regexPrototype->GetType() == library->GetRegexPrototypeType();
    }